

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O2

Oop __thiscall Lodtalk::VMContext::setGlobalVariable(VMContext *this,Oop symbol,Oop value)

{
  int iVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar2;
  Ref<Lodtalk::Association> newGlobalVar;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40 [4];
  
  aVar2 = (anon_union_8_4_0eb573b0_for_Oop_0)
          IdentityDictionary::getAssociationOrNil
                    (&this->globalDictionary->super_IdentityDictionary,symbol);
  iVar1 = classIndexOf((Oop)aVar2);
  if (iVar1 == 0x2c) {
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)((long)aVar2 + 0x10) = value.field_0;
  }
  else {
    aVar2.header = (ObjectHeader *)GlobalVariable::make(this,symbol,value);
    OopRef::OopRef((OopRef *)local_40,this);
    local_40[0].header = aVar2.header;
    IdentityDictionary::putAssociation
              (&this->globalDictionary->super_IdentityDictionary,this,(Oop)aVar2);
    aVar2 = local_40[0];
    OopRef::~OopRef((OopRef *)local_40);
  }
  return (Oop)aVar2.pointer;
}

Assistant:

Oop VMContext::setGlobalVariable(Oop symbol, Oop value)
{
	// Set the existing value.
	auto globalVar = globalDictionary->getNativeAssociationOrNil(symbol);
	if(classIndexOf(Oop::fromPointer(globalVar)) == SCI_GlobalVariable)
	{
		globalVar->value = value;
		return Oop::fromPointer(globalVar);
	}

	// Create the global variable
	Ref<Association> newGlobalVar(this, GlobalVariable::make(this, symbol, value));
	globalDictionary->putNativeAssociation(this, newGlobalVar.get());
	return newGlobalVar.getOop();
}